

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O2

void printByteCode(Code_attribute codeAttribute,cp_info *constantPool,uint8_t indentation)

{
  byte bVar1;
  u1 uVar2;
  u1 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  FILE *__stream;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  char *__format;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  byte bVar19;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  undefined1 auVar20 [16];
  char cVar24;
  char cVar31;
  char cVar32;
  char cVar33;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  uint local_58;
  uint local_54;
  uint local_4c;
  uint local_48;
  uint local_44;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar26 [16];
  undefined2 uVar34;
  
  uVar13 = 0;
  uVar12 = 1;
LAB_00113343:
  while( true ) {
    uVar16 = (uint)uVar13;
    if (codeAttribute.code_length <= uVar16) {
      return;
    }
    Utils::printTabs(out,indentation);
    uVar17 = uVar12 + 1;
    uVar11 = uVar16;
    fprintf((FILE *)out,"%d\t%d\t%s",(ulong)uVar12,uVar13,instructions[codeAttribute.code[uVar13]]);
    __stream = out;
    bVar1 = codeAttribute.code[uVar13];
    auVar20 = pshuflw(ZEXT216(CONCAT11(bVar1,bVar1)),ZEXT216(CONCAT11(bVar1,bVar1)),0);
    bVar19 = auVar20[0] - 0x1a;
    bVar21 = auVar20[1] - 0x3b;
    bVar22 = auVar20[2] + 0x7b;
    bVar23 = auVar20[3] + 0x54;
    cVar24 = -((byte)((bVar19 < 0x1c) * '\x1c' | (bVar19 >= 0x1c) * bVar19) == bVar19);
    cVar31 = -((byte)((bVar21 < 0x49) * 'I' | (bVar21 >= 0x49) * bVar21) == bVar21);
    cVar32 = -((byte)((bVar22 < 0x14) * '\x14' | (bVar22 >= 0x14) * bVar22) == bVar22);
    cVar33 = -((byte)((bVar23 < 6) * '\x06' | (bVar23 >= 6) * bVar23) == bVar23);
    auVar25._0_13_ = ZEXT613(0xffffffffffff) << 0x38;
    auVar26[0xd] = 0xff;
    auVar26._0_13_ = auVar25._0_13_;
    auVar26[0xe] = 0xff;
    auVar26[0xf] = 0xff;
    auVar25._14_2_ = auVar26._14_2_;
    auVar25[0xd] = 0xff;
    Var9 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54((int5)(CONCAT45((int)(
                                                  CONCAT36(auVar25._13_3_,0xffffffffffff) >> 0x28),
                                                  0xffffffffff) >> 0x20),0xffffffff) >> 0x18),
                                                  0xffffff) >> 0x10),0xffff) >> 8),cVar33),cVar33);
    auVar8._2_10_ = Var9;
    auVar8[1] = cVar32;
    auVar8[0] = cVar32;
    auVar7._2_12_ = auVar8;
    auVar7[1] = cVar31;
    auVar7[0] = cVar31;
    auVar20._0_2_ = CONCAT11(cVar24,cVar24);
    auVar20._2_14_ = auVar7;
    uVar34 = (undefined2)Var9;
    auVar30._0_12_ = auVar20._0_12_;
    auVar30._12_2_ = uVar34;
    auVar30._14_2_ = uVar34;
    auVar29._12_4_ = auVar30._12_4_;
    auVar29._0_10_ = auVar20._0_10_;
    auVar29._10_2_ = auVar8._0_2_;
    auVar28._10_6_ = auVar29._10_6_;
    auVar28._0_8_ = auVar20._0_8_;
    auVar28._8_2_ = auVar8._0_2_;
    auVar27._8_8_ = auVar28._8_8_;
    auVar27._6_2_ = auVar7._0_2_;
    auVar27._4_2_ = auVar7._0_2_;
    auVar27._2_2_ = auVar20._0_2_;
    auVar27._0_2_ = auVar20._0_2_;
    iVar10 = movmskps(uVar11,auVar27);
    if ((iVar10 == 0xf) && (0xf < bVar1)) break;
LAB_00113466:
    fputc(10,(FILE *)out);
    uVar13 = (ulong)(uVar16 + 1);
    uVar12 = uVar17;
  }
  switch(bVar1) {
  case 0x10:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
switchD_00113433_caseD_10:
    fprintf((FILE *)out," %d\n",(ulong)codeAttribute.code[uVar13 + 1]);
    break;
  case 0x11:
    fprintf((FILE *)out," %d\n",
            (ulong)((int)(short)((ushort)codeAttribute.code[uVar13 + 1] << 8) |
                   (uint)codeAttribute.code[uVar16 + 2]));
    goto LAB_00113574;
  case 0x12:
    bVar1 = codeAttribute.code[uVar13 + 1];
    pcVar15 = getFormattedConstant(constantPool,(ushort)bVar1);
    __format = " #%d <%s>\n";
    uVar13 = (ulong)bVar1;
LAB_001134dc:
    fprintf((FILE *)__stream,__format,uVar13,pcVar15);
    break;
  case 0x13:
  case 0x14:
switchD_00113433_caseD_13:
    uVar2 = codeAttribute.code[uVar13 + 1];
    uVar3 = codeAttribute.code[uVar16 + 2];
    pcVar15 = getFormattedConstant(constantPool,CONCAT11(uVar2,uVar3));
    fprintf((FILE *)__stream," #%d <%s>\n",(ulong)CONCAT11(uVar2,uVar3),pcVar15);
LAB_00113574:
    uVar13 = (ulong)(uVar16 + 3);
    uVar12 = uVar17;
    goto LAB_00113343;
  default:
    uVar11 = bVar1 - 0xa9;
    if (uVar11 < 0x1b) {
      if ((0x6600000U >> (uVar11 & 0x1f) & 1) != 0) goto LAB_00113466;
      if (uVar11 == 0) goto switchD_00113433_caseD_10;
      if (uVar11 == 0x13) {
        uVar13 = (ulong)codeAttribute.code[uVar13 + 1];
        pcVar15 = &DAT_001263e4 + *(int *)(&DAT_001263d4 + uVar13 * 4);
        __format = " %d (%s)\n";
        goto LAB_001134dc;
      }
    }
    if (bVar1 - 0x36 < 5) goto switchD_00113433_caseD_10;
    if (bVar1 == 0x84) {
      uVar14 = (ulong)codeAttribute.code[uVar13 + 1];
      uVar13 = (ulong)codeAttribute.code[uVar16 + 2];
      pcVar15 = " %d by %d\n";
LAB_00113419:
      fprintf((FILE *)out,pcVar15,uVar14,uVar13);
      goto LAB_00113574;
    }
    if (((byte)(bVar1 + 0x4e) < 7) ||
       ((bVar1 - 0xbb < 7 && ((0x65U >> (bVar1 - 0xbb & 0x1f) & 1) != 0))))
    goto switchD_00113433_caseD_13;
    if ((byte)(bVar1 + 0x67) < 0x10) {
switchD_001135d0_caseD_c6:
      uVar12 = (int)(short)((ushort)codeAttribute.code[uVar13 + 1] << 8) |
               (uint)codeAttribute.code[uVar16 + 2];
      uVar13 = (ulong)uVar12;
      uVar14 = (ulong)(uVar16 + uVar12);
      pcVar15 = " %d (%+d)\n";
      goto LAB_00113419;
    }
    switch(bVar1) {
    case 0xb9:
      uVar2 = codeAttribute.code[uVar13 + 1];
      uVar3 = codeAttribute.code[uVar16 + 2];
      pcVar15 = getFormattedConstant(constantPool,CONCAT11(uVar2,uVar3));
      fprintf((FILE *)__stream," #%d <%s> count %d\n",(ulong)CONCAT11(uVar2,uVar3),pcVar15,
              (ulong)codeAttribute.code[uVar16 + 3]);
      if (codeAttribute.code[uVar16 + 4] != '\0') {
        __assert_fail("code[i+4] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/classviewer.cpp"
                      ,0x1ea,"void printByteCode(Code_attribute, cp_info *, uint8_t)");
      }
      break;
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf:
    case 0xc0:
    case 0xc1:
    case 0xc2:
    case 0xc3:
switchD_001135d0_caseD_ba:
      fwrite("Invalid instruction opcode.\n",0x1c,1,(FILE *)out);
      exit(7);
    case 0xc4:
      uVar2 = codeAttribute.code[uVar16 + 2];
      uVar3 = codeAttribute.code[uVar16 + 3];
      fputc(10,(FILE *)out);
      Utils::printTabs(out,indentation);
      fprintf((FILE *)out,"%d\t%d\t%s %d",(ulong)uVar17,uVar13 + 1,
              instructions[codeAttribute.code[uVar13 + 1]],(ulong)CONCAT11(uVar2,uVar3));
      uVar17 = uVar16 + 4;
      if (codeAttribute.code[uVar13 + 1] == 0x84) {
        fprintf((FILE *)out," by %d",
                (ulong)((int)(short)((ushort)codeAttribute.code[uVar17] << 8) |
                       (uint)codeAttribute.code[uVar16 + 5]));
        uVar17 = uVar16 + 6;
      }
      uVar12 = uVar12 + 2;
      fputc(10,(FILE *)out);
      uVar13 = (ulong)uVar17;
      goto LAB_00113343;
    case 0xc5:
      uVar2 = codeAttribute.code[uVar13 + 1];
      uVar3 = codeAttribute.code[uVar16 + 2];
      pcVar15 = getFormattedConstant(constantPool,CONCAT11(uVar2,uVar3));
      fprintf((FILE *)__stream," #%d <%s> dim %d\n",(ulong)CONCAT11(uVar2,uVar3),pcVar15,
              (ulong)codeAttribute.code[uVar16 + 3]);
      uVar13 = (ulong)(uVar16 + 4);
      uVar12 = uVar17;
      goto LAB_00113343;
    case 0xc6:
    case 199:
      goto switchD_001135d0_caseD_c6;
    case 200:
    case 0xc9:
      fprintf((FILE *)out," %d (%+d)\n",
              (ulong)(((uint)codeAttribute.code[uVar16 + 4] |
                      (uint)codeAttribute.code[uVar16 + 3] << 8 |
                      (uint)codeAttribute.code[uVar16 + 2] << 0x10 |
                      (uint)codeAttribute.code[uVar13 + 1] << 0x18) + uVar16));
      break;
    default:
      if (bVar1 == 0xaa) {
        uVar11 = uVar16 + 1 & 3;
        bVar1 = codeAttribute.code[uVar11 + uVar16 + 1];
        bVar19 = codeAttribute.code[uVar11 + uVar16 + 2];
        bVar21 = codeAttribute.code[uVar11 + uVar16 + 3];
        bVar22 = codeAttribute.code[uVar11 + uVar16 + 4];
        local_58 = (uint)codeAttribute.code[uVar11 + uVar16 + 8] |
                   (uint)codeAttribute.code[uVar11 + uVar16 + 7] << 8 |
                   (uint)codeAttribute.code[uVar11 + uVar16 + 6] << 0x10 |
                   (uint)codeAttribute.code[uVar11 + uVar16 + 5] << 0x18;
        uVar12 = (uint)codeAttribute.code[uVar11 + uVar16 + 0xc] |
                 (uint)codeAttribute.code[uVar11 + uVar16 + 0xb] << 8 |
                 (uint)codeAttribute.code[uVar11 + uVar16 + 10] << 0x10 |
                 (uint)codeAttribute.code[uVar11 + uVar16 + 9] << 0x18;
        fprintf((FILE *)out," %d to %d\n",(ulong)local_58,(ulong)uVar12);
        iVar10 = (uVar12 - local_58) + 1;
        uVar12 = uVar11 + uVar16 + 0xd;
        while (bVar18 = iVar10 != 0, iVar10 = iVar10 + -1, bVar18) {
          uVar11 = (uint)codeAttribute.code[uVar12 + 3] |
                   (uint)codeAttribute.code[uVar12 + 2] << 8 |
                   (uint)codeAttribute.code[uVar12 + 1] << 0x10 |
                   (uint)codeAttribute.code[uVar12] << 0x18;
          Utils::printTabs(out,indentation);
          fprintf((FILE *)out,"%d\t\t\t%d: %d (%+d)\n",(ulong)uVar17,(ulong)local_58,
                  (ulong)(uVar11 + uVar16),(ulong)uVar11);
          local_58 = local_58 + 1;
          uVar12 = uVar12 + 4;
          uVar17 = uVar17 + 1;
        }
      }
      else {
        if (bVar1 != 0xab) goto switchD_001135d0_caseD_ba;
        uVar12 = uVar16 + 1 & 3;
        bVar1 = codeAttribute.code[uVar12 + uVar16 + 1];
        bVar19 = codeAttribute.code[uVar12 + uVar16 + 2];
        bVar21 = codeAttribute.code[uVar12 + uVar16 + 3];
        bVar22 = codeAttribute.code[uVar12 + uVar16 + 4];
        local_58 = (uint)codeAttribute.code[uVar12 + uVar16 + 8] |
                   (uint)codeAttribute.code[uVar12 + uVar16 + 7] << 8 |
                   (uint)codeAttribute.code[uVar12 + uVar16 + 6] << 0x10 |
                   (uint)codeAttribute.code[uVar12 + uVar16 + 5] << 0x18;
        fprintf((FILE *)out," %d\n");
        uVar12 = uVar12 + uVar16 + 9;
        while (bVar18 = local_58 != 0, local_58 = local_58 - 1, bVar18) {
          bVar23 = codeAttribute.code[uVar12];
          bVar4 = codeAttribute.code[uVar12 + 1];
          bVar5 = codeAttribute.code[uVar12 + 2];
          bVar6 = codeAttribute.code[uVar12 + 3];
          uVar11 = (uint)codeAttribute.code[uVar12 + 7] |
                   (uint)codeAttribute.code[uVar12 + 6] << 8 |
                   (uint)codeAttribute.code[uVar12 + 5] << 0x10 |
                   (uint)codeAttribute.code[uVar12 + 4] << 0x18;
          Utils::printTabs(out,indentation);
          fprintf((FILE *)out,"%d\t\t\t%d: %d (%+d)\n",(ulong)uVar17,
                  (ulong)((uint)bVar6 |
                         (uint)bVar5 << 8 | (uint)bVar4 << 0x10 | (uint)bVar23 << 0x18),
                  (ulong)(uVar11 + uVar16),(ulong)uVar11);
          uVar12 = uVar12 + 8;
          uVar17 = uVar17 + 1;
        }
      }
      local_44 = (uint)bVar1;
      local_48 = (uint)bVar21 << 8;
      local_4c = (uint)bVar22;
      local_54 = (uint)bVar19 << 0x10;
      Utils::printTabs(out,indentation);
      fprintf((FILE *)out,"%d\t\t\tdefault: %d (%+d)\n",(ulong)uVar17,
              (ulong)(uVar16 + (local_54 | local_44 << 0x18 | local_48 | local_4c)));
      uVar13 = (ulong)uVar12;
      uVar12 = uVar17 + 1;
      goto LAB_00113343;
    }
    uVar13 = (ulong)(uVar16 + 5);
    uVar12 = uVar17;
    goto LAB_00113343;
  }
  uVar13 = (ulong)(uVar16 + 2);
  uVar12 = uVar17;
  goto LAB_00113343;
}

Assistant:

void printByteCode(Code_attribute codeAttribute, cp_info *constantPool, uint8_t indentation) {
    u4 code_length = codeAttribute.code_length;
    u1 *code = codeAttribute.code;
    
    uint32_t lineNumber = 1;
    u4 i = 0;
    while (i < code_length) {
        Utils::printTabs(out, indentation);
        fprintf(out,"%d\t%d\t%s", lineNumber++, i, instructions[code[i]]);
        
        if (code[i] <= 0x0f || (code[i] >= 0x1a && code[i] <= 0x35) || (code[i] >= 0x3b && code[i] <= 0x83) || (code[i] >= 0x85 && code[i] <= 0x98) ||
            (code[i] >= 0xac && code[i] <= 0xb1) || code[i] == 0xbe || code[i] == 0xbf || code[i] == 0xc2 || code[i] == 0xc3) {
            fprintf(out,"\n");
            i += 1;
        } else if (code[i] == 0x12) { // usa CP
            fprintf(out," #%d <%s>\n", code[i+1], getFormattedConstant(constantPool, code[i+1]));
            i += 2;
        } else if (code[i] == 0xbc) { // newarray
            u1 atype = code[i+1];
            const char* types[] = {"boolean", "char", "float", "double", "byte", "short", "int", "long"};
            fprintf(out," %d (%s)\n", atype, types[atype-4]);
            i += 2;
        } else if (code[i] == 0x10 || (code[i] >= 0x15 && code[i] <= 0x19) || (code[i] >= 0x36 && code[i] <= 0x3a) || code[i] == 0xa9) {
            fprintf(out," %d\n", code[i+1]);
            i += 2;
        } else if (code[i] == 0x11) { // sipush
            int16_t number = (code[i+1] << 8) | code[i+2];
            fprintf(out," %d\n", number);
            i += 3;
        } else if (code[i] == 0x84) { // iinc
            fprintf(out," %d by %d\n", code[i+1], code[i+2]);
            i += 3;
        } else if (code[i] == 0x13 || code[i] == 0x14 || (code[i] >= 0xb2 && code[i] <= 0xb8) ||
                   code[i] == 0xbb || code[i] == 0xbd || code[i] == 0xc0 || code[i] == 0xc1) { // usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s>\n", number, getFormattedConstant(constantPool, number));
            i += 3;
        } else if ((code[i] >= 0x99 && code[i] <= 0xa8) || code[i] == 0xc6 || code[i] == 0xc7) {
            int16_t number = (code[i+1] << 8) | code[i+2];
            fprintf(out," %d (%+d)\n", i+number, number);
            i += 3;
        } else if (code[i] == 0xc5) { // multianewarray - usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s> dim %d\n", number, getFormattedConstant(constantPool, number), code[i+3]);
            i += 4;
        } else if (code[i] == 0xb9) { // invokeinterface - usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s> count %d\n", number, getFormattedConstant(constantPool, number), code[i+3]);
            assert(code[i+4] == 0);
            i += 5;
        } else if (code[i] == 0xc8 || code[i] == 0xc9) { // goto_w e jsr_w
            int32_t number = (code[i+1] << 24) | (code[i+2] << 16) | (code[i+3] << 8) | code[i+4];
            fprintf(out," %d (%+d)\n", i+number, number);
            i += 5;
        } else if (code[i] == 0xc4) { // wide
            u2 indexbyte = (code[i+2] << 8) | code[i+3];
            
            fprintf(out,"\n");
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t%d\t%s %d", lineNumber++, i+1, instructions[code[i+1]], indexbyte);
            
            if (code[i+1] == 0x84) { // format 2 (iinc)
                int16_t constbyte = (code[i+4] << 8) | code[i+5];
                fprintf(out," by %d", constbyte);
                i += 6;
            } else {
                i += 4;
            }
            
            fprintf(out,"\n");
        } else if (code[i] == 0xaa) { // tableswitch
            u1 padding = (i+1) % 4;
            int32_t defaultbytes = (code[padding+i+1] << 24) | (code[padding+i+2] << 16) | (code[padding+i+3] << 8) | code[padding+i+4];
            int32_t lowbytes = (code[padding+i+5] << 24) | (code[padding+i+6] << 16) | (code[padding+i+7] << 8) | code[padding+i+8];
            int32_t highbytes = (code[padding+i+9] << 24) | (code[padding+i+10] << 16) | (code[padding+i+11] << 8) | code[padding+i+12];
            
            fprintf(out," %d to %d\n", lowbytes, highbytes);
            
            u4 howManyBytes = 1 + padding + 12; // 1 (instruction) + padding + 12 (the 12 bytes above)
            int32_t offsets = highbytes - lowbytes + 1;
            
            for (u4 n = 0; n < offsets; n++) {
                int32_t offset = (code[i+howManyBytes] << 24) | (code[i+howManyBytes+1] << 16) | (code[i+howManyBytes+2] << 8) | code[i+howManyBytes+3];
                Utils::printTabs(out, indentation);
                fprintf(out,"%d\t\t\t%d: %d (%+d)\n", lineNumber++, lowbytes, i + offset, offset);
                
                lowbytes++;
                howManyBytes += 4;
            }
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t\t\tdefault: %d (%+d)\n", lineNumber++, i + defaultbytes, defaultbytes);
            
            i += howManyBytes;
        } else if (code[i] == 0xab) { // lookupswitch
            u1 padding = (i+1) % 4;
            int32_t defaultbytes = (code[padding+i+1] << 24) | (code[padding+i+2] << 16) | (code[padding+i+3] << 8) | code[padding+i+4];
            int32_t npairs = (code[padding+i+5] << 24) | (code[padding+i+6] << 16) | (code[padding+i+7] << 8) | code[padding+i+8];
            
            u4 howManyBytes = 1 + padding + 8; // 1 (instruction) + padding + 8 (the 8 bytes above)
            
            fprintf(out," %d\n", npairs);
            
            for (u4 n = 0; n < npairs; n++) {
                int32_t match = (code[i+howManyBytes] << 24) | (code[i+howManyBytes+1] << 16) | (code[i+howManyBytes+2] << 8) | code[i+howManyBytes+3];
                int32_t offset = (code[i+howManyBytes+4] << 24) | (code[i+howManyBytes+5] << 16) | (code[i+howManyBytes+6] << 8) | code[i+howManyBytes+7];
                Utils::printTabs(out, indentation);
                fprintf(out,"%d\t\t\t%d: %d (%+d)\n", lineNumber++, match, i + offset, offset);
                howManyBytes += 8;
            }
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t\t\tdefault: %d (%+d)\n", lineNumber++, i + defaultbytes, defaultbytes);
            
            i += howManyBytes;
        } else {
            fprintf(out,"Invalid instruction opcode.\n");
            exit(7);
        }
    }
}